

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

int INT_CMCondition_has_signaled(CManager cm,int condition)

{
  CMCondition p_Var1;
  undefined4 in_ESI;
  CMControlList cl;
  CMCondition cond;
  int retval;
  undefined8 in_stack_ffffffffffffffe0;
  int condition_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  condition_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  set_debug_flag((CManager)0x129ce4);
  p_Var1 = CMCondition_find((CMControlList)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),condition_00);
  if (p_Var1 == (CMCondition)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = p_Var1->signaled;
  }
  return local_4;
}

Assistant:

extern int
INT_CMCondition_has_signaled(CManager cm, int condition)
{
    int retval;
    CMCondition cond;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);

    cond = CMCondition_find(cl, condition);
    if (!cond) return -1;
    retval = cond->signaled;
    
    return retval;
}